

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

double HTS_PStream_calc_derivative(HTS_PStream *pst,size_t m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  size_t sVar5;
  double *pdVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  size_t in_RSI;
  HTS_PStream *in_RDI;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double w;
  double hmmobj;
  double gvobj;
  double h;
  double dv;
  double vari;
  double mean;
  size_t i;
  size_t t;
  double local_50;
  double local_30;
  double local_28;
  ulong local_20;
  ulong local_18;
  size_t local_10;
  HTS_PStream *local_8;
  
  lVar8 = in_RDI->win_size * in_RDI->length;
  auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar12._0_8_ = lVar8;
  auVar12._12_4_ = 0x45300000;
  dVar10 = 1.0 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
  local_10 = in_RSI;
  local_8 = in_RDI;
  HTS_PStream_calc_gv(in_RDI,in_RSI,&local_28,&local_30);
  dVar1 = local_8->gv_vari[local_10];
  dVar2 = local_8->gv_mean[local_10];
  dVar3 = local_8->gv_vari[local_10];
  dVar4 = local_8->gv_mean[local_10];
  sVar5 = local_8->length;
  auVar13._8_4_ = (int)(sVar5 >> 0x20);
  auVar13._0_8_ = sVar5;
  auVar13._12_4_ = 0x45300000;
  for (local_18 = 0; local_18 < local_8->length; local_18 = local_18 + 1) {
    (local_8->sm).g[local_18] = *(local_8->sm).wuw[local_18] * local_8->par[local_18][local_10];
    for (local_20 = 1; local_20 < local_8->width; local_20 = local_20 + 1) {
      if (local_18 + local_20 < local_8->length) {
        pdVar6 = (local_8->sm).g;
        pdVar6[local_18] =
             (local_8->sm).wuw[local_18][local_20] * local_8->par[local_18 + local_20][local_10] +
             pdVar6[local_18];
      }
      if (local_20 < local_18 + 1) {
        pdVar6 = (local_8->sm).g;
        pdVar6[local_18] =
             (local_8->sm).wuw[local_18 - local_20][local_20] *
             local_8->par[local_18 - local_20][local_10] + pdVar6[local_18];
      }
    }
  }
  local_50 = 0.0;
  for (local_18 = 0; local_18 < local_8->length; local_18 = local_18 + 1) {
    local_50 = dVar10 * local_8->par[local_18][local_10] *
               ((local_8->sm).g[local_18] * -0.5 + (local_8->sm).wum[local_18]) + local_50;
    sVar7 = local_8->length;
    lVar9 = sVar7 * sVar7;
    auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    lVar8 = sVar7 - 1;
    auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar15._0_8_ = lVar8;
    auVar15._12_4_ = 0x45300000;
    dVar11 = -dVar10 * *(local_8->sm).wuw[local_18] +
             -((2.0 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) *
              (((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) *
               local_8->gv_vari[local_10] * (local_30 - local_8->gv_mean[local_10]) +
              local_8->gv_vari[local_10] * 2.0 * (local_8->par[local_18][local_10] - local_28) *
              (local_8->par[local_18][local_10] - local_28)));
    if (local_8->gv_switch[local_18] == '\0') {
      (local_8->sm).g[local_18] =
           (1.0 / dVar11) *
           dVar10 * 1.0 * (-(local_8->sm).g[local_18] + (local_8->sm).wum[local_18]);
    }
    else {
      (local_8->sm).g[local_18] =
           (1.0 / dVar11) *
           (dVar10 * 1.0 * (-(local_8->sm).g[local_18] + (local_8->sm).wum[local_18]) +
           ((dVar3 * -2.0 * (local_30 - dVar4)) /
           ((auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))) * 1.0 *
           (local_8->par[local_18][local_10] - local_28));
    }
  }
  return -(local_50 + local_30 * -0.5 * dVar1 * (local_30 - (dVar2 + dVar2)));
}

Assistant:

static double HTS_PStream_calc_derivative(HTS_PStream * pst, size_t m)
{
   size_t t, i;
   double mean;
   double vari;
   double dv;
   double h;
   double gvobj;
   double hmmobj;
   double w = 1.0 / (pst->win_size * pst->length);

   HTS_PStream_calc_gv(pst, m, &mean, &vari);
   gvobj = -0.5 * W2 * vari * pst->gv_vari[m] * (vari - 2.0 * pst->gv_mean[m]);
   dv = -2.0 * pst->gv_vari[m] * (vari - pst->gv_mean[m]) / pst->length;

   for (t = 0; t < pst->length; t++) {
      pst->sm.g[t] = pst->sm.wuw[t][0] * pst->par[t][m];
      for (i = 1; i < pst->width; i++) {
         if (t + i < pst->length)
            pst->sm.g[t] += pst->sm.wuw[t][i] * pst->par[t + i][m];
         if (t + 1 > i)
            pst->sm.g[t] += pst->sm.wuw[t - i][i] * pst->par[t - i][m];
      }
   }

   for (t = 0, hmmobj = 0.0; t < pst->length; t++) {
      hmmobj += W1 * w * pst->par[t][m] * (pst->sm.wum[t] - 0.5 * pst->sm.g[t]);
      h = -W1 * w * pst->sm.wuw[t][1 - 1] - W2 * 2.0 / (pst->length * pst->length) * ((pst->length - 1) * pst->gv_vari[m] * (vari - pst->gv_mean[m]) + 2.0 * pst->gv_vari[m] * (pst->par[t][m] - mean) * (pst->par[t][m] - mean));
      if (pst->gv_switch[t])
         pst->sm.g[t] = 1.0 / h * (W1 * w * (-pst->sm.g[t] + pst->sm.wum[t]) + W2 * dv * (pst->par[t][m] - mean));
      else
         pst->sm.g[t] = 1.0 / h * (W1 * w * (-pst->sm.g[t] + pst->sm.wum[t]));
   }

   return (-(hmmobj + gvobj));
}